

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CheckData(CopyTest *this,GLenum target,GLuint size)

{
  ostringstream *this_00;
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLubyte *pGVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  string local_200;
  string local_1e0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar6 = (ulong)size;
  pGVar3 = (GLubyte *)operator_new__(uVar6);
  this->m_result = pGVar3;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xaa0))(target,0,0x1908,0x1401,pGVar3);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x157c);
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar6 == uVar5) goto LAB_00b298df;
    uVar1 = uVar5 + 1;
  } while ((&s_texture_data)[uVar5] == this->m_result[uVar5]);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  pcVar4 = "glCopyTextureSubImage*D created texture with data ";
  std::operator<<((ostream *)this_00,"glCopyTextureSubImage*D created texture with data ");
  DataToString_abi_cxx11_(&local_1e0,(CopyTest *)pcVar4,size,"");
  std::operator<<((ostream *)this_00,(string *)&local_1e0);
  pcVar4 = " however texture contains data ";
  std::operator<<((ostream *)this_00," however texture contains data ");
  DataToString_abi_cxx11_(&local_200,(CopyTest *)pcVar4,size,this->m_result);
  std::operator<<((ostream *)this_00,(string *)&local_200);
  std::operator<<((ostream *)this_00,". Texture target was ");
  local_1c0.m_getName = glu::getTextureTargetName;
  local_1c0.m_value = target;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,". Test fails.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00b298df:
  return uVar6 <= uVar5;
}

Assistant:

bool CopyTest::CheckData(glw::GLenum target, glw::GLuint size)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getTexImage(target, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < size; ++i)
	{
		if (s_texture_data[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCopyTextureSubImage*D created texture with data "
				<< DataToString(size, s_texture_data) << " however texture contains data "
				<< DataToString(size, m_result) << ". Texture target was " << glu::getTextureTargetStr(target)
				<< ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}